

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 jsonHexToInt4(char *z)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  u32 v;
  char *z_local;
  
  bVar1 = jsonHexToInt((int)*z);
  bVar2 = jsonHexToInt((int)z[1]);
  bVar3 = jsonHexToInt((int)z[2]);
  bVar4 = jsonHexToInt((int)z[3]);
  return (uint)bVar1 * 0x1000 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10 + (uint)bVar4;
}

Assistant:

static u32 jsonHexToInt4(const char *z){
  u32 v;
  assert( sqlite3Isxdigit(z[0]) );
  assert( sqlite3Isxdigit(z[1]) );
  assert( sqlite3Isxdigit(z[2]) );
  assert( sqlite3Isxdigit(z[3]) );
  v = (jsonHexToInt(z[0])<<12)
    + (jsonHexToInt(z[1])<<8)
    + (jsonHexToInt(z[2])<<4)
    + jsonHexToInt(z[3]);
  return v;
}